

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_add_str(tnt_stream *s,char *str,uint32_t len)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined1 local_58 [8];
  iovec v [2];
  char local_2e [8];
  char data [6];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  pcVar4 = mp_encode_strl(local_2e,len);
  v[0].iov_base = pcVar4 + -(long)local_2e;
  v[1].iov_base = (void *)(ulong)len;
  local_58 = (undefined1  [8])local_2e;
  v[0].iov_len = (size_t)str;
  sVar5 = (*s->writev)(s,(iovec *)local_58,2);
  return sVar5;
}

Assistant:

ssize_t
tnt_object_add_str (struct tnt_stream *s, const char *str, uint32_t len)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	struct iovec v[2]; int v_sz = 2;
	char data[6], *end;
	end = mp_encode_strl(data, len);
	v[0].iov_base = data;
	v[0].iov_len  = end - data;
	v[1].iov_base = (void *)str;
	v[1].iov_len  = len;
	return s->writev(s, v, v_sz);
}